

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRVariable * __thiscall
spirv_cross::Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
          (Compiler *this,uint32_t id,uint *args,StorageClass *args_1,uint *args_2)

{
  SPIRVariable *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeVariable,(ID)id);
  pSVar1 = variant_set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id,args,args_1,
                      args_2);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}